

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O2

void parse_options(int argc,char **argv,int program,_func_void_varargs *help,
                  _func_void_varargs *version)

{
  option_type_t oVar1;
  cartridge_t cart;
  undefined1 auVar2 [16];
  int iVar3;
  option_t *poVar4;
  char *pcVar5;
  size_t sVar6;
  ushort **ppuVar7;
  int iVar8;
  char *__s;
  char *pcVar9;
  char cVar10;
  long lVar11;
  
  poVar4 = get_option("-o");
  pcVar5 = (char *)mmalloc(7);
  (poVar4->value).str = pcVar5;
  builtin_strncpy(pcVar5,"out.gb",7);
  for (lVar11 = 1; lVar11 < argc; lVar11 = lVar11 + 1) {
    if ((*argv[lVar11] == '-') && (poVar4 = get_option(argv[lVar11]), poVar4 != (option_t *)0x0)) {
      pcVar5 = poVar4->name;
      iVar3 = strcmp(pcVar5,"--help");
      if ((iVar3 == 0) || (iVar3 = strcmp(pcVar5,"--version"), iVar3 == 0)) {
        poVar4->set = 1;
      }
    }
  }
  poVar4 = get_option("--help");
  if ((poVar4->set != 0) || (poVar4 = get_option("--version"), help = version, poVar4->set != 0)) {
    (*help)();
    return;
  }
  iVar3 = 1;
  do {
    if (argc <= iVar3) {
      iVar3 = file_count();
      if (iVar3 == 0) {
        ccerr(F,"no input files.");
      }
      poVar4 = get_option("-E");
      iVar3 = poVar4->set;
      poVar4 = get_option("-S");
      iVar8 = poVar4->set;
      poVar4 = get_option("-c");
      if ((((iVar3 != 0 || iVar8 != 0) || poVar4->set != 0) &&
          (poVar4 = get_option("-o"), poVar4->set != 0)) && (iVar3 = file_count(), 1 < iVar3)) {
        pcVar5 = "cannot specify -o with -c with multiple files";
        if (program == 0) {
          pcVar5 = "cannot specify -o with -E, -S or -c with multiple files";
        }
        ccerr(F,pcVar5);
      }
      poVar4 = get_option("-ftabstop=");
      if ((poVar4->value).num - 0x65U < 0xffffff9c) {
        (poVar4->value).num = 8;
        poVar4->set = 0;
      }
      auVar2 = ZEXT816(0) << 0x40;
      cart.title[0] = 'O';
      cart.title[1] = 'U';
      cart.title[2] = 'T';
      cart.title[3] = '.';
      cart.gb_type = auVar2._0_4_;
      cart.cart_type = auVar2._4_4_;
      cart.rom_size = auVar2._8_4_;
      cart.ram_size = auVar2._12_4_;
      cart.title[4] = 'G';
      cart.title[5] = 'B';
      cart.title[6] = ' ';
      cart.title[7] = ' ';
      cart.title[8] = ' ';
      cart.title[9] = ' ';
      cart.title[10] = ' ';
      cart._27_1_ = 0;
      set_cartridge(cart);
      return;
    }
    pcVar5 = argv[iVar3];
    if (*pcVar5 == '-') {
      poVar4 = get_option(pcVar5);
      if (poVar4 == (option_t *)0x0) {
LAB_00106432:
        pcVar9 = "unrecognized command line option \'%s\'.";
        __s = pcVar5;
LAB_0010643f:
        ccerr(E,pcVar9,__s);
      }
      else {
        __s = poVar4->name;
        sVar6 = strlen(__s);
        if (program == 2) {
          iVar8 = poVar4->ld_opt;
joined_r0x00106430:
          if (iVar8 == 0) goto LAB_00106432;
        }
        else if (program == 1) {
          iVar8 = poVar4->as_opt;
          goto joined_r0x00106430;
        }
        poVar4->set = 1;
        oVar1 = poVar4->type;
        if (oVar1 == flag) {
          if (pcVar5[sVar6] != '\0') {
            ccerr(E,"unrecognized command line option \'%s\'.",pcVar5);
          }
        }
        else if (oVar1 == string) {
          sVar6 = strlen(__s);
          pcVar9 = pcVar5 + sVar6;
          if (pcVar5[sVar6] == '\0') {
            if ((pcVar9[-1] == '=') || (iVar3 == argc + -1)) {
              pcVar5 = poVar4->argname;
            }
            else {
              pcVar9 = argv[(long)iVar3 + 1];
              if (*pcVar9 != '\0') {
                iVar3 = iVar3 + 1;
                goto LAB_00106468;
              }
              pcVar5 = poVar4->argname;
            }
            ccerr(E,"missing %s after \'%s\'",pcVar5,__s);
          }
          else {
LAB_00106468:
            pcVar5 = (poVar4->value).str;
            sVar6 = strlen(pcVar9);
            pcVar5 = (char *)mrealloc(pcVar5,sVar6 + 1);
            (poVar4->value).str = pcVar5;
            strcpy(pcVar5,pcVar9);
          }
        }
        else if (oVar1 == number) {
          cVar10 = pcVar5[sVar6];
          if (cVar10 == '\0') {
            pcVar9 = "missing argument to \'%s\'";
            goto LAB_0010643f;
          }
          ppuVar7 = __ctype_b_loc();
          pcVar5 = pcVar5 + sVar6;
          iVar8 = 0;
          while (pcVar5 = pcVar5 + 1, cVar10 != '\0') {
            if ((*(byte *)((long)*ppuVar7 + (long)cVar10 * 2 + 1) & 8) == 0) {
              pcVar9 = "argument to \'%s\' should be a non-negative integer.";
              goto LAB_0010643f;
            }
            iVar8 = iVar8 * 10 + (int)cVar10 + -0x30;
            cVar10 = *pcVar5;
          }
          (poVar4->value).num = iVar8;
        }
      }
    }
    else {
      file_add(pcVar5);
    }
    iVar3 = iVar3 + 1;
  } while( true );
}

Assistant:

void parse_options(int argc, char** argv, int program, void(*help)(),
                   void(*version)())
{
    int i;
    option_t* opt;

    opt = get_option("-o");
    opt->value.str = (char*)mmalloc(7);
    strcpy(opt->value.str, "out.gb");

    for (i = 1; i < argc; ++i)
    {
        char* p = argv[i];
        if (*p == '-')
        {
            opt = get_option(p);
            if (!opt)
                continue;
            if (strcmp(opt->name, "--help") == 0)
                opt->set = 1;
            else if (strcmp(opt->name, "--version") == 0)
                opt->set = 1;
        }
    }

    /* Leave the function before source files are added */
    if (get_option("--help")->set)
    {
        (*help)();
        return;
    }

    if (get_option("--version")->set)
    {
        (*version)();
        return;
    }

    for (i = 1; i < argc; ++i)
    {
        char* p = argv[i];
        if (*p == '-')
        {
            /* HANDLE ADDITIONAL INCLUDE PATHS LIB PATHS ETC HERE */
            if ((opt = get_option(argv[i])))
            {
                p += strlen(opt->name);

                if (program == GBAS && !opt->as_opt)
                {
                    ccerr(E, "unrecognized command line option '%s'.", argv[i]);
                    continue;
                }

                if (program == GBLD && !opt->ld_opt)
                {
                    ccerr(E, "unrecognized command line option '%s'.", argv[i]);
                    continue;
                }

                opt->set = 1;
                if (opt->type != flag)
                {
                    if (opt->type == number)
                        read_number(p, opt);
                    else if (opt->type == string)
                        read_string(opt, &i, argc, argv);
                }
                else if (*p)
                {
                    /* Option name matched but there were additional
                    characters */
                    ccerr(E, "unrecognized command line option '%s'.", argv[i]);
                    continue;
                }
            }
            else
                ccerr(E, "unrecognized command line option '%s'.", argv[i]);
        }
        else
        {
            file_add(argv[i]);
        }
    }

    if (!file_count())
        ccerr(F, "no input files.");

    if ( (get_option("-E")->set | get_option("-S")->set | get_option("-c")->set)
         && get_option("-o")->set)
    {
        if (file_count() > 1)
        {
            if (program == GBCC)
                ccerr(F, "cannot specify -o with -E, -S or -c with multiple "
                         "files");
            else
                ccerr(F, "cannot specify -o with -c with multiple files");

        }
    }

    opt = get_option("-ftabstop=");
    if (opt->value.num < 1 || opt->value.num > 100)
    {
        opt->value.num = 8;
        opt->set = 0;
    }
    
    set_cartridge(cartridge);
}